

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_pool.cpp
# Opt level: O2

void __thiscall duckdb::EvictionQueue::PurgeIteration(EvictionQueue *this,idx_t purge_size)

{
  vector<duckdb::BufferEvictionNode,_true> *this_00;
  ulong uVar1;
  size_t sVar2;
  reference element;
  long lVar3;
  size_type __n;
  __normal_iterator<duckdb::BufferEvictionNode_*,_std::vector<duckdb::BufferEvictionNode,_std::allocator<duckdb::BufferEvictionNode>_>_>
  itemFirst;
  shared_ptr<duckdb::BlockHandle,_true> handle;
  
  itemFirst._M_current =
       (this->purge_nodes).
       super_vector<duckdb::BufferEvictionNode,_std::allocator<duckdb::BufferEvictionNode>_>.
       super__Vector_base<duckdb::BufferEvictionNode,_std::allocator<duckdb::BufferEvictionNode>_>.
       _M_impl.super__Vector_impl_data._M_start;
  uVar1 = ((long)(this->purge_nodes).
                 super_vector<duckdb::BufferEvictionNode,_std::allocator<duckdb::BufferEvictionNode>_>
                 .
                 super__Vector_base<duckdb::BufferEvictionNode,_std::allocator<duckdb::BufferEvictionNode>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)itemFirst._M_current) / 0x18;
  this_00 = &this->purge_nodes;
  if (uVar1 < purge_size || purge_size < uVar1 >> 1) {
    ::std::vector<duckdb::BufferEvictionNode,_std::allocator<duckdb::BufferEvictionNode>_>::resize
              (&this_00->
                super_vector<duckdb::BufferEvictionNode,_std::allocator<duckdb::BufferEvictionNode>_>
               ,purge_size);
    itemFirst._M_current =
         (this_00->
         super_vector<duckdb::BufferEvictionNode,_std::allocator<duckdb::BufferEvictionNode>_>).
         super__Vector_base<duckdb::BufferEvictionNode,_std::allocator<duckdb::BufferEvictionNode>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  sVar2 = duckdb_moodycamel::
          ConcurrentQueue<duckdb::BufferEvictionNode,duckdb_moodycamel::ConcurrentQueueDefaultTraits>
          ::
          try_dequeue_bulk<__gnu_cxx::__normal_iterator<duckdb::BufferEvictionNode*,std::vector<duckdb::BufferEvictionNode,std::allocator<duckdb::BufferEvictionNode>>>>
                    ((ConcurrentQueue<duckdb::BufferEvictionNode,duckdb_moodycamel::ConcurrentQueueDefaultTraits>
                      *)&this->q,itemFirst,purge_size);
  lVar3 = 0;
  for (__n = 0; sVar2 != __n; __n = __n + 1) {
    element = vector<duckdb::BufferEvictionNode,_true>::get<true>(this_00,__n);
    BufferEvictionNode::TryGetBlockHandle((BufferEvictionNode *)&handle);
    if (handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != (element_type *)0x0) {
      duckdb_moodycamel::
      ConcurrentQueue<duckdb::BufferEvictionNode,duckdb_moodycamel::ConcurrentQueueDefaultTraits>::
      inner_enqueue<(duckdb_moodycamel::ConcurrentQueue<duckdb::BufferEvictionNode,duckdb_moodycamel::ConcurrentQueueDefaultTraits>::AllocationMode)0,duckdb::BufferEvictionNode>
                ((ConcurrentQueue<duckdb::BufferEvictionNode,duckdb_moodycamel::ConcurrentQueueDefaultTraits>
                  *)&this->q,element);
      lVar3 = lVar3 + 1;
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&handle.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  LOCK();
  (this->total_dead_nodes).super___atomic_base<unsigned_long>._M_i =
       (this->total_dead_nodes).super___atomic_base<unsigned_long>._M_i - (sVar2 - lVar3);
  UNLOCK();
  return;
}

Assistant:

void EvictionQueue::PurgeIteration(const idx_t purge_size) {
	// if this purge is significantly smaller or bigger than the previous purge, then
	// we need to resize the purge_nodes vector. Note that this barely happens, as we
	// purge queue_insertions * PURGE_SIZE_MULTIPLIER nodes
	idx_t previous_purge_size = purge_nodes.size();
	if (purge_size < previous_purge_size / 2 || purge_size > previous_purge_size) {
		purge_nodes.resize(purge_size);
	}

	// bulk purge
	idx_t actually_dequeued = q.try_dequeue_bulk(purge_nodes.begin(), purge_size);

	// retrieve all alive nodes that have been wrongly dequeued
	idx_t alive_nodes = 0;
	for (idx_t i = 0; i < actually_dequeued; i++) {
		auto &node = purge_nodes[i];
		auto handle = node.TryGetBlockHandle();
		if (handle) {
			q.enqueue(std::move(node));
			alive_nodes++;
		}
	}

	total_dead_nodes -= actually_dequeued - alive_nodes;
}